

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O0

ZyanStatus
ZyanVectorBinarySearchEx
          (ZyanVector *vector,void *element,ZyanUSize *found_index,ZyanComparison comparison,
          ZyanUSize index,ZyanUSize count)

{
  ZyanI32 ZVar1;
  long lVar2;
  ZyanI32 cmp;
  ZyanUSize mid;
  ZyanISize h;
  ZyanISize l;
  ZyanStatus status;
  ZyanUSize count_local;
  ZyanUSize index_local;
  ZyanComparison comparison_local;
  ZyanUSize *found_index_local;
  void *element_local;
  ZyanVector *vector_local;
  
  if (vector == (ZyanVector *)0x0) {
    vector_local._4_4_ = 0x80100004;
  }
  else if (((index < vector->size) || (count == 0)) && (index + count <= vector->size)) {
    if (count == 0) {
      *found_index = index;
      vector_local._4_4_ = 0x100003;
    }
    else {
      if (vector->element_size == 0) {
        __assert_fail("vector->element_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                      ,0x2cc,
                      "ZyanStatus ZyanVectorBinarySearchEx(const ZyanVector *, const void *, ZyanUSize *, ZyanComparison, ZyanUSize, ZyanUSize)"
                     );
      }
      if (vector->data == (void *)0x0) {
        __assert_fail("vector->data",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                      ,0x2cd,
                      "ZyanStatus ZyanVectorBinarySearchEx(const ZyanVector *, const void *, ZyanUSize *, ZyanComparison, ZyanUSize, ZyanUSize)"
                     );
      }
      l._4_4_ = 0x100003;
      mid = (index + count) - 1;
      h = index;
      while (h <= (long)mid) {
        lVar2 = h + ((long)(mid - h) >> 1);
        ZVar1 = (*comparison)((void *)((long)vector->data + lVar2 * vector->element_size),element);
        if (ZVar1 < 0) {
          h = lVar2 + 1;
        }
        else {
          mid = lVar2 - 1;
          if (ZVar1 == 0) {
            l._4_4_ = 0x100002;
          }
        }
      }
      *found_index = h;
      vector_local._4_4_ = l._4_4_;
    }
  }
  else {
    vector_local._4_4_ = 0x80100008;
  }
  return vector_local._4_4_;
}

Assistant:

ZyanStatus ZyanVectorBinarySearchEx(const ZyanVector* vector, const void* element,
    ZyanUSize* found_index, ZyanComparison comparison, ZyanUSize index, ZyanUSize count)
{
    if (!vector)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
    if (((index >= vector->size) && (count > 0)) || (index + count > vector->size))
    {
        return ZYAN_STATUS_OUT_OF_RANGE;
    }

    if (!count)
    {
        *found_index = index;
        return ZYAN_STATUS_FALSE;
    }

    ZYAN_ASSERT(vector->element_size);
    ZYAN_ASSERT(vector->data);

    ZyanStatus status = ZYAN_STATUS_FALSE;
    ZyanISize l = index;
    ZyanISize h = index + count - 1;
    while (l <= h)
    {
        const ZyanUSize mid = l + ((h - l) >> 1);
        const ZyanI32 cmp = comparison(ZYCORE_VECTOR_OFFSET(vector, mid), element);
        if (cmp < 0)
        {
            l = mid + 1;
        } else
        {
            h = mid - 1;
            if (cmp == 0)
            {
                status = ZYAN_STATUS_TRUE;
            }
        }
    }

    *found_index = l;
    return status;
}